

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>>
               (char spec,int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *handler)

{
  char in_DIL;
  int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *unaff_retaddr;
  int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_00000090;
  int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_000000d0;
  int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_00000160;
  
  if (in_DIL == '\0') {
LAB_002ceebc:
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(in_stack_000000d0);
    return;
  }
  if (in_DIL == 'B') {
LAB_002ceed4:
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(in_stack_000000d0);
  }
  else {
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_002ceed4;
      if (in_DIL == 'd') goto LAB_002ceebc;
      if (in_DIL == 'n') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num(in_stack_00000160);
        return;
      }
      if (in_DIL == 'o') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct(in_stack_000000d0);
        return;
      }
      if (in_DIL != 'x') {
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_error(unaff_retaddr);
      }
    }
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::
    int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(in_stack_00000090);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}